

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::ReserveForSummary(BamStandardIndex *this,int *numReferences)

{
  vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
  *in_RDI;
  size_type in_stack_ffffffffffffffb8;
  BaiReferenceSummary local_28;
  
  std::
  vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
  ::clear((vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
           *)0x2cf371);
  BaiReferenceSummary::BaiReferenceSummary(&local_28);
  std::
  vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
  ::assign(in_RDI,in_stack_ffffffffffffffb8,(value_type *)0x2cf3aa);
  return;
}

Assistant:

void BamStandardIndex::ReserveForSummary(const int& numReferences)
{
    m_indexFileSummary.clear();
    m_indexFileSummary.assign(numReferences, BaiReferenceSummary());
}